

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O3

void soplex::LPFwriteRow<double>
               (SPxLPBase<double> *p_lp,ostream *p_output,NameSet *p_cnames,
               SVectorBase<double> *p_svec,double *p_lhs,double *p_rhs)

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  char *pcVar4;
  
  LPFwriteSVector<double>(p_lp,p_output,p_cnames,p_svec,false);
  dVar1 = *p_lhs;
  if ((dVar1 != *p_rhs) || (NAN(dVar1) || NAN(*p_rhs))) {
    ::soplex::infinity::__tls_init();
    pdVar2 = (double *)__tls_get_addr(&PTR_003b4b70);
    if (-*pdVar2 < dVar1) {
      std::__ostream_insert<char,std::char_traits<char>>(p_output," >= ",4);
      p_rhs = p_lhs;
      goto LAB_001792c8;
    }
    pcVar4 = " <= ";
    lVar3 = 4;
  }
  else {
    pcVar4 = " = ";
    lVar3 = 3;
  }
  std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar4,lVar3);
LAB_001792c8:
  std::ostream::_M_insert<double>(*p_rhs);
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"\n",1);
  return;
}

Assistant:

static void LPFwriteRow(
   const SPxLPBase<R>&   p_lp,       ///< the LP
   std::ostream&         p_output,   ///< output stream
   const NameSet*        p_cnames,   ///< column names
   const SVectorBase<R>& p_svec,     ///< vector of the row
   const R&              p_lhs,      ///< lhs of the row
   const R&              p_rhs       ///< rhs of the row
)
{

   LPFwriteSVector(p_lp, p_output, p_cnames, p_svec);

   if(p_lhs == p_rhs)
      p_output << " = " << p_rhs;
   else if(p_lhs <= R(-infinity))
      p_output << " <= " << p_rhs;
   else
   {
      assert(p_rhs >= R(infinity));
      p_output << " >= " << p_lhs;
   }

   p_output << "\n";
}